

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagParser::parse(TagParser *this,string *str)

{
  ulong uVar1;
  ulong uVar2;
  ulong in_RSI;
  long *in_RDI;
  undefined1 auVar3 [16];
  size_t end;
  char c;
  size_t pos;
  string local_48 [32];
  ulong local_28;
  char local_19;
  ulong local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  for (local_18 = 0; uVar1 = local_18, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      local_18 = local_18 + 1) {
    auVar3 = std::__cxx11::string::operator[](local_10);
    local_19 = *auVar3._0_8_;
    if (local_19 == '[') {
      auVar3 = std::__cxx11::string::find_first_of((char)local_10,0x5d);
      local_28 = auVar3._0_8_;
      if (local_28 == 0xffffffffffffffff) {
        (**(code **)(*in_RDI + 0x18))(in_RDI,(int)local_19,auVar3._8_8_,local_19);
      }
      else {
        std::__cxx11::string::substr((ulong)local_48,local_10);
        (**(code **)(*in_RDI + 0x10))(in_RDI,local_48);
        std::__cxx11::string::~string(local_48);
        local_18 = local_28;
      }
    }
    else {
      (**(code **)(*in_RDI + 0x18))(in_RDI,(int)local_19,auVar3._8_8_,local_19);
    }
  }
  (**(code **)(*in_RDI + 0x20))();
  return;
}

Assistant:

void parse( std::string const& str ) {
            std::size_t pos = 0;
            while( pos < str.size() ) {
                char c = str[pos];
                if( c == '[' ) {
                    std::size_t end = str.find_first_of( ']', pos );
                    if( end != std::string::npos ) {
                        acceptTag( str.substr( pos+1, end-pos-1 ) );
                        pos = end+1;
                    }
                    else {
                        acceptChar( c );
                        pos++;
                    }
                }
                else {
                    acceptChar( c );
                    pos++;
                }
            }
            endParse();
        }